

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmodel.hpp
# Opt level: O1

bool __thiscall
QtMWidgets::ListModel<QColor>::setData(ListModel<QColor> *this,int row,QColor *value)

{
  ListModelPrivate<QColor> *pLVar1;
  long lVar2;
  undefined8 uVar3;
  reference pQVar4;
  long i;
  
  i = (long)row;
  pLVar1 = (this->d).d;
  lVar2 = (pLVar1->data).d.size;
  if (i < lVar2) {
    pQVar4 = QList<QColor>::operator[](&pLVar1->data,i);
    uVar3 = *(undefined8 *)((long)&value->ct + 2);
    *(undefined8 *)pQVar4 = *(undefined8 *)value;
    *(undefined8 *)((long)&pQVar4->ct + 2) = uVar3;
    AbstractListModel::dataChanged(&this->super_AbstractListModel,row,row);
  }
  return i < lVar2;
}

Assistant:

virtual bool setData( int row, const T & value )
	{
		if( row >= d->data.count() )
			return false;

		d->data[ row ] = value;

		emit dataChanged( row, row );

		return true;
	}